

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::XPathScanner::scanExpression
          (XPathScanner *this,XMLCh *data,XMLSize_t currentOffset,XMLSize_t endOffset,
          ValueVectorOf<int> *tokens)

{
  XMLSize_t XVar1;
  char cVar2;
  XMLStringPool *pXVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  ulong uVar7;
  _func_int *p_Var8;
  ulong uVar9;
  XPathException *pXVar10;
  undefined8 uVar11;
  long lVar12;
  ulong uVar13;
  XPathScanner *this_00;
  bool bVar14;
  XMLCh XVar15;
  XMLSize_t XVar16;
  bool bVar17;
  XMLBuffer dataBuffer;
  XMLCh str [2];
  int local_8c;
  XMLBuffer local_78;
  XMLCh local_3c [2];
  long local_38;
  
  local_78.fMemoryManager = tokens->fMemoryManager;
  local_78.fIndex = 0;
  local_78.fCapacity = 0x80;
  local_78.fFullSize = 0;
  local_78.fUsed = false;
  local_78.fFullHandler = (XMLBufferFullHandler *)0x0;
  iVar5 = (*(local_78.fMemoryManager)->_vptr_MemoryManager[3])(local_78.fMemoryManager,0x102);
  local_78.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar5);
  *local_78.fBuffer = L'\0';
  if (currentOffset == endOffset) {
LAB_0030fd66:
    bVar14 = true;
LAB_0030fd69:
    (*(local_78.fMemoryManager)->_vptr_MemoryManager[4])(local_78.fMemoryManager,local_78.fBuffer);
    return bVar14;
  }
  XVar1 = endOffset - 1;
  local_38 = 2 - endOffset;
  bVar17 = false;
LAB_0030fdbb:
  lVar12 = currentOffset * -2;
  uVar7 = currentOffset + 2;
  XVar16 = currentOffset;
  while( true ) {
    local_3c[0] = data[XVar16];
    if (-1 < (char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)local_3c[0]]) break;
    XVar16 = XVar16 + 1;
    lVar12 = lVar12 + -2;
    uVar7 = uVar7 + 1;
    if (endOffset == XVar16) goto LAB_0030fd66;
  }
  if (endOffset == XVar16) goto LAB_0030fd66;
  if (0x7f < (ushort)local_3c[0]) {
switchD_0030fe62_caseD_14:
    bVar14 = false;
    if (((ulong)(ushort)data[XVar16] != 0x3a) &&
       (((&XMLChar1_0::fgCharCharsTable1_0)[(ushort)data[XVar16]] & 2) != 0)) {
      uVar7 = XVar16;
      uVar13 = XVar16 + 1;
      if (XVar16 + 1 < endOffset) {
        uVar13 = endOffset;
      }
      do {
        uVar7 = uVar7 + 1;
        currentOffset = uVar13;
        if (endOffset <= uVar7) break;
        currentOffset = uVar7;
      } while (((&XMLChar1_0::fgCharCharsTable1_0)[(ushort)data[uVar7]] & 1) != 0);
      if (currentOffset - XVar16 != 0) {
        if (currentOffset < endOffset) {
          uVar7 = (ulong)(ushort)data[currentOffset];
        }
        else {
          uVar7 = 0;
        }
        local_78.fIndex = 0;
        XMLBuffer::append(&local_78,(XMLCh *)((long)data - lVar12),currentOffset - XVar16);
        pXVar3 = this->fStringPool;
        local_78.fBuffer[local_78.fIndex] = L'\0';
        local_8c = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])();
        iVar5 = -1;
        if ((short)uVar7 == 0x3a) {
          XVar16 = currentOffset + 1;
          if (XVar16 == endOffset) goto LAB_003108a2;
          XVar15 = data[XVar16];
          if (XVar15 == L':') {
            uVar7 = 0x3a;
            bVar4 = true;
            bVar14 = false;
          }
          else {
            if (XVar15 != L'*') {
              if (((&XMLChar1_0::fgCharCharsTable1_0)[(ushort)XVar15] & 2) != 0) {
                uVar7 = currentOffset + 2;
                uVar13 = uVar7;
                if (uVar7 < endOffset) {
                  uVar13 = endOffset;
                }
                do {
                  uVar9 = uVar7;
                  currentOffset = uVar13;
                  if (endOffset <= uVar9) break;
                  uVar7 = uVar9 + 1;
                  currentOffset = uVar9;
                } while (((&XMLChar1_0::fgCharCharsTable1_0)[(ushort)data[uVar9]] & 1) != 0);
                if (currentOffset - XVar16 != 0) {
                  if (currentOffset < endOffset) {
                    uVar7 = (ulong)(ushort)data[currentOffset];
                  }
                  else {
                    uVar7 = 0;
                  }
                  local_78.fIndex = 0;
                  XMLBuffer::append(&local_78,data + XVar16,currentOffset - XVar16);
                  pXVar3 = this->fStringPool;
                  local_78.fBuffer[local_78.fIndex] = L'\0';
                  iVar6 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])();
                  bVar14 = false;
                  bVar4 = false;
                  iVar5 = local_8c;
                  local_8c = iVar6;
                  goto LAB_0030ffeb;
                }
              }
              goto LAB_003108a2;
            }
            uVar7 = 0x2a;
            bVar14 = true;
            bVar4 = false;
          }
          currentOffset = currentOffset + 2;
          if (currentOffset < endOffset) {
            uVar7 = (ulong)(ushort)data[currentOffset];
          }
        }
        else {
          bVar14 = false;
          bVar4 = false;
        }
LAB_0030ffeb:
        XVar15 = (XMLCh)uVar7;
        cVar2 = (&XMLChar1_0::fgCharCharsTable1_0)[uVar7];
        while ((cVar2 < '\0' &&
               (XVar16 = currentOffset + 1, currentOffset = endOffset, XVar16 != endOffset))) {
          XVar15 = data[XVar16];
          cVar2 = (&XMLChar1_0::fgCharCharsTable1_0)[(ushort)XVar15];
          currentOffset = XVar16;
        }
        if (bVar17) {
          uVar11 = 0x10;
          if ((((local_8c == this->fAndSymbol) || (uVar11 = 0x11, local_8c == this->fOrSymbol)) ||
              (uVar11 = 0x12, local_8c == this->fModSymbol)) ||
             (uVar11 = 0x13, local_8c == this->fDivSymbol)) {
            (*this->_vptr_XPathScanner[2])(this,tokens,uVar11);
            bVar17 = false;
            if (!bVar14 && !bVar4) goto LAB_00310825;
          }
        }
        else {
          if ((!bVar4 && !bVar14) && XVar15 == L'(') {
            uVar11 = 0xc;
            if (((local_8c == this->fCommentSymbol) || (uVar11 = 0xd, local_8c == this->fTextSymbol)
                ) || (uVar11 = 0xe, local_8c == this->fPISymbol)) {
              p_Var8 = this->_vptr_XPathScanner[2];
LAB_00310190:
              (*p_Var8)(this,tokens,uVar11);
            }
            else {
              p_Var8 = this->_vptr_XPathScanner[2];
              uVar11 = 0xf;
              if (local_8c == this->fNodeSymbol) goto LAB_00310190;
              (*p_Var8)(this,tokens,0x20);
              ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
              XVar16 = tokens->fCurCount;
              tokens->fCurCount = XVar16 + 1;
              tokens->fElemList[XVar16] = iVar5;
              ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
              XVar16 = tokens->fCurCount;
              tokens->fCurCount = XVar16 + 1;
              tokens->fElemList[XVar16] = local_8c;
            }
            (*this->_vptr_XPathScanner[2])(this,tokens,0);
            XVar16 = currentOffset;
            goto LAB_003101a9;
          }
          if ((!bVar4) &&
             (((XVar15 != L':' || (endOffset <= currentOffset + 1)) ||
              (data[currentOffset + 1] != L':')))) {
            if (bVar14) {
              (*this->_vptr_XPathScanner[2])(this,tokens,10);
              ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
            }
            else {
              (*this->_vptr_XPathScanner[2])(this,tokens,0xb);
              ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
              XVar16 = tokens->fCurCount;
              tokens->fCurCount = XVar16 + 1;
              tokens->fElemList[XVar16] = iVar5;
              ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
            }
            goto LAB_00310806;
          }
          uVar11 = 0x21;
          if (((((local_8c == this->fAncestorSymbol) ||
                (uVar11 = 0x22, local_8c == this->fAncestorOrSelfSymbol)) ||
               (uVar11 = 0x23, local_8c == this->fAttributeSymbol)) ||
              (((uVar11 = 0x24, local_8c == this->fChildSymbol ||
                (uVar11 = 0x25, local_8c == this->fDescendantSymbol)) ||
               ((((uVar11 = 0x26, local_8c == this->fDescendantOrSelfSymbol ||
                  ((uVar11 = 0x27, local_8c == this->fFollowingSymbol ||
                   (uVar11 = 0x28, local_8c == this->fFollowingSiblingSymbol)))) ||
                 (uVar11 = 0x29, local_8c == this->fNamespaceSymbol)) ||
                ((((uVar11 = 0x2a, local_8c == this->fParentSymbol ||
                   (uVar11 = 0x2b, local_8c == this->fPrecedingSymbol)) ||
                  (uVar11 = 0x2c, local_8c == this->fPrecedingSiblingSymbol)) ||
                 (uVar11 = 0x2d, local_8c == this->fSelfSymbol)))))))) &&
             ((*this->_vptr_XPathScanner[2])(this,tokens,uVar11), !bVar14)) {
            (*this->_vptr_XPathScanner[2])(this,tokens,8);
            if (!bVar4) {
              currentOffset = currentOffset + 2;
            }
            goto LAB_003101ac;
          }
        }
      }
      goto LAB_003108a2;
    }
    goto LAB_0030fd69;
  }
  switch(fASCIICharMap[(ushort)local_3c[0]]) {
  case 3:
    if ((XVar1 == XVar16) || (data[XVar16 + 1] != L'=')) goto LAB_003108a2;
    (*this->_vptr_XPathScanner[2])(this,tokens,0x1b);
LAB_003105c0:
    currentOffset = XVar16 + 2;
    goto LAB_003101ac;
  case 4:
    if (XVar1 != XVar16) {
      XVar15 = data[XVar16 + 1];
      uVar7 = XVar16;
      while (uVar13 = uVar7 + 1, XVar15 != local_3c[0]) {
        if (local_38 + uVar13 == 1) goto LAB_003108a2;
        XVar15 = data[uVar7 + 2];
        uVar7 = uVar13;
      }
      (*this->_vptr_XPathScanner[2])(this,tokens,0x2e);
      local_78.fIndex = 0;
      XMLBuffer::append(&local_78,(XMLCh *)((long)data + (2 - lVar12)),~XVar16 + uVar13);
      pXVar3 = this->fStringPool;
      local_78.fBuffer[local_78.fIndex] = L'\0';
      iVar5 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])();
      ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
      XVar16 = tokens->fCurCount;
      tokens->fCurCount = XVar16 + 1;
      tokens->fElemList[XVar16] = iVar5;
      currentOffset = uVar7 + 2;
      bVar17 = true;
      goto LAB_00310825;
    }
    goto LAB_003108a2;
  case 5:
    if (XVar1 == XVar16) goto LAB_003108a2;
    bVar14 = false;
    if (((ulong)(ushort)data[XVar16 + 1] == 0x3a) ||
       (((&XMLChar1_0::fgCharCharsTable1_0)[(ushort)data[XVar16 + 1]] & 2) == 0)) goto LAB_0030fd69;
    uVar13 = XVar16 + 2;
    if (XVar16 + 2 < endOffset) {
      uVar13 = endOffset;
    }
    do {
      uVar9 = uVar7;
      currentOffset = uVar13;
      if (endOffset <= uVar9) break;
      uVar7 = uVar9 + 1;
      currentOffset = uVar9;
    } while (((&XMLChar1_0::fgCharCharsTable1_0)[(ushort)data[uVar9]] & 1) != 0);
    if (currentOffset - 1 == XVar16) goto LAB_003108a2;
    if (currentOffset < endOffset) {
      bVar17 = data[currentOffset] == L':';
    }
    else {
      bVar17 = false;
    }
    local_78.fIndex = 0;
    XMLBuffer::append(&local_78,(XMLCh *)((long)data + (2 - lVar12)),~XVar16 + currentOffset);
    pXVar3 = this->fStringPool;
    local_78.fBuffer[local_78.fIndex] = L'\0';
    iVar6 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])();
    iVar5 = -1;
    local_8c = iVar6;
    if (!bVar17) {
LAB_003107bf:
      (*this->_vptr_XPathScanner[2])(this,tokens,0x30);
      ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
      XVar16 = tokens->fCurCount;
      tokens->fCurCount = XVar16 + 1;
      tokens->fElemList[XVar16] = iVar5;
      ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
LAB_00310806:
      XVar16 = tokens->fCurCount;
      tokens->fCurCount = XVar16 + 1;
      tokens->fElemList[XVar16] = local_8c;
      goto LAB_00310822;
    }
    XVar16 = currentOffset + 1;
    if (XVar16 != endOffset) {
      bVar14 = false;
      if (((ulong)(ushort)data[XVar16] != 0x3a) &&
         (((&XMLChar1_0::fgCharCharsTable1_0)[(ushort)data[XVar16]] & 2) != 0)) {
        uVar7 = currentOffset + 2;
        uVar13 = uVar7;
        if (uVar7 < endOffset) {
          uVar13 = endOffset;
        }
        do {
          uVar9 = uVar7;
          currentOffset = uVar13;
          if (endOffset <= uVar9) break;
          uVar7 = uVar9 + 1;
          currentOffset = uVar9;
        } while (((&XMLChar1_0::fgCharCharsTable1_0)[(ushort)data[uVar9]] & 1) != 0);
        if (currentOffset - XVar16 != 0) {
          local_78.fIndex = 0;
          XMLBuffer::append(&local_78,data + XVar16,currentOffset - XVar16);
          pXVar3 = this->fStringPool;
          local_78.fBuffer[local_78.fIndex] = L'\0';
          local_8c = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])();
          iVar5 = iVar6;
          goto LAB_003107bf;
        }
        goto LAB_003108a2;
      }
      goto LAB_0030fd69;
    }
    goto LAB_003108a2;
  case 6:
    (*this->_vptr_XPathScanner[2])(this,tokens,0);
    break;
  case 7:
    (*this->_vptr_XPathScanner[2])(this,tokens,1);
    goto LAB_003104ed;
  case 8:
    bVar17 = !bVar17;
    if (bVar17) {
      (*this->_vptr_XPathScanner[2])(this,tokens,9);
    }
    else {
      (*this->_vptr_XPathScanner[2])(this,tokens,0x14);
    }
    currentOffset = XVar16 + 1;
    goto LAB_00310825;
  case 9:
    (*this->_vptr_XPathScanner[2])(this,tokens,0x18);
    break;
  case 10:
    (*this->_vptr_XPathScanner[2])(this,tokens,7);
    break;
  case 0xb:
    (*this->_vptr_XPathScanner[2])(this,tokens,0x19);
    break;
  case 0xc:
    if (XVar1 != XVar16) {
      local_3c[0] = data[XVar16 + 1];
      if ((ulong)(ushort)local_3c[0] == 0x2e) {
        (*this->_vptr_XPathScanner[2])(this,tokens,5);
        currentOffset = XVar16 + 2;
        goto LAB_00310822;
      }
      if ((ushort)(local_3c[0] + L'￐') < 10) goto switchD_0030fe62_caseD_e;
      if ((local_3c[0] == L'|') || (local_3c[0] == L'/')) {
        (*this->_vptr_XPathScanner[2])(this,tokens,4);
        goto LAB_003104ed;
      }
      if (-1 < (char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)local_3c[0]]) {
        local_3c[1] = 0;
        pXVar10 = (XPathException *)__cxa_allocate_exception(0x30);
        XPathException::XPathException
                  (pXVar10,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                   ,0x37c,XPath_InvalidChar,local_3c,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   tokens->fMemoryManager);
        __cxa_throw(pXVar10,&XPathException::typeinfo,XMLException::~XMLException);
      }
      do {
        currentOffset = endOffset;
        if (XVar1 == XVar16) goto LAB_00310888;
        XVar15 = data[XVar16 + 1];
        currentOffset = XVar16 + 1;
        XVar16 = currentOffset;
      } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)XVar15] < '\0');
      if ((XVar15 == L'|') || (XVar15 == L'/')) {
LAB_00310888:
        (*this->_vptr_XPathScanner[2])(this,tokens,4);
        bVar17 = true;
      }
      goto LAB_00310825;
    }
    uVar11 = 4;
LAB_003108c4:
    (*this->_vptr_XPathScanner[2])(this,tokens,uVar11);
    bVar14 = true;
    goto LAB_0030fd69;
  case 0xd:
    if (XVar1 == XVar16) {
      uVar11 = 0x15;
      goto LAB_003108c4;
    }
    if (data[XVar16 + 1] == L'/') {
      (*this->_vptr_XPathScanner[2])(this,tokens,0x16);
      goto LAB_003105c0;
    }
    (*this->_vptr_XPathScanner[2])(this,tokens,0x15);
    break;
  case 0xe:
switchD_0030fe62_caseD_e:
    this_00 = this;
    (*this->_vptr_XPathScanner[2])(this,tokens,0x2f);
    currentOffset = scanNumber(this_00,data,endOffset,XVar16,tokens);
    goto LAB_00310822;
  case 0xf:
    if ((XVar1 != XVar16) && (data[XVar16 + 1] == L':')) {
      (*this->_vptr_XPathScanner[2])(this,tokens,8);
      goto LAB_003105c0;
    }
LAB_003108a2:
    bVar14 = false;
    goto LAB_0030fd69;
  case 0x10:
    if (XVar1 == XVar16) {
      uVar11 = 0x1c;
      goto LAB_003108c4;
    }
    if (data[XVar16 + 1] == L'=') {
      (*this->_vptr_XPathScanner[2])(this,tokens,0x1d);
      goto LAB_003105c0;
    }
    (*this->_vptr_XPathScanner[2])(this,tokens,0x1c);
    break;
  case 0x11:
    (*this->_vptr_XPathScanner[2])(this,tokens,0x1a);
    break;
  case 0x12:
    if (XVar1 == XVar16) {
      uVar11 = 0x1e;
      goto LAB_003108c4;
    }
    if (data[XVar16 + 1] == L'=') {
      (*this->_vptr_XPathScanner[2])(this,tokens,0x1f);
      goto LAB_003105c0;
    }
    (*this->_vptr_XPathScanner[2])(this,tokens,0x1e);
    break;
  case 0x13:
    (*this->_vptr_XPathScanner[2])(this,tokens,6);
    break;
  case 0x14:
  case 0x17:
  case 0x19:
    goto switchD_0030fe62_caseD_14;
  case 0x15:
    (*this->_vptr_XPathScanner[2])(this,tokens,2);
    break;
  case 0x16:
    (*this->_vptr_XPathScanner[2])(this,tokens,3);
LAB_003104ed:
    currentOffset = XVar16 + 1;
LAB_00310822:
    bVar17 = true;
    goto LAB_00310825;
  case 0x18:
    (*this->_vptr_XPathScanner[2])(this,tokens,0x17);
    break;
  default:
    local_3c[1] = 0;
    pXVar10 = (XPathException *)__cxa_allocate_exception(0x30);
    XPathException::XPathException
              (pXVar10,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
               ,0x539,XPath_InvalidChar,local_3c,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               tokens->fMemoryManager);
    __cxa_throw(pXVar10,&XPathException::typeinfo,XMLException::~XMLException);
  }
LAB_003101a9:
  currentOffset = XVar16 + 1;
LAB_003101ac:
  bVar17 = false;
LAB_00310825:
  if (currentOffset == endOffset) goto LAB_0030fd66;
  goto LAB_0030fdbb;
}

Assistant:

bool XPathScanner::scanExpression(const XMLCh* const data,
                                  XMLSize_t currentOffset,
                                  const XMLSize_t endOffset,
                                  ValueVectorOf<int>* const tokens) {

    bool      starIsMultiplyOperator = false;
    XMLSize_t nameOffset = 0;
    int       nameHandle = -1;
    int       prefixHandle = -1;
    XMLCh     ch;
    XMLBuffer dataBuffer(128, tokens->getMemoryManager());

    while (currentOffset != endOffset) {

        ch = data[currentOffset];

        while (XMLChar1_0::isWhitespace(ch)) {

            if (++currentOffset == endOffset) {
                break;
            }

            ch = data[currentOffset];
        }

        if (currentOffset == endOffset) {
            break;
        }
        //
        // [28] ExprToken ::= '(' | ')' | '[' | ']' | '.' | '..' | '@' | ',' | '::'
        //                  | NameTest | NodeType | Operator | FunctionName
        //                  | AxisName | Literal | Number | VariableReference
        //
        XMLByte chartype = (ch >= 0x80) ? (XMLByte)CHARTYPE_NONASCII : fASCIICharMap[ch];

        switch (chartype) {
        case CHARTYPE_OPEN_PAREN:       // '('
            addToken(tokens, XercesXPath::EXPRTOKEN_OPEN_PAREN);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_CLOSE_PAREN:      // ')'
            addToken(tokens, XercesXPath::EXPRTOKEN_CLOSE_PAREN);
            starIsMultiplyOperator = true;
            ++currentOffset;
            break;
        case CHARTYPE_OPEN_BRACKET:     // '['
            addToken(tokens, XercesXPath::EXPRTOKEN_OPEN_BRACKET);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_CLOSE_BRACKET:    // ']'
            addToken(tokens, XercesXPath::EXPRTOKEN_CLOSE_BRACKET);
            starIsMultiplyOperator = true;
            ++currentOffset;
            break;
                //
                // [30] Number ::= Digits ('.' Digits?)? | '.' Digits
                //                                         ^^^^^^^^^^
                //
        case CHARTYPE_PERIOD:           // '.', '..' or '.' Digits
            if (currentOffset + 1 == endOffset) {
                addToken(tokens, XercesXPath::EXPRTOKEN_PERIOD);
                starIsMultiplyOperator = true;
                currentOffset++;
                break;
            }

            ch = data[currentOffset + 1];

            if (ch == chPeriod) {            // '..'
                addToken(tokens, XercesXPath::EXPRTOKEN_DOUBLE_PERIOD);
                starIsMultiplyOperator = true;
                currentOffset += 2;
            } else if (ch >= chDigit_0 && ch <= chDigit_9) {
                addToken(tokens, XercesXPath::EXPRTOKEN_NUMBER);
                starIsMultiplyOperator = true;
                currentOffset = scanNumber(data, endOffset, currentOffset, tokens);
            } else if (ch == chForwardSlash) {
                addToken(tokens, XercesXPath::EXPRTOKEN_PERIOD);
                starIsMultiplyOperator = true;
                currentOffset++;
            } else if (ch == chPipe) { // '|'
                addToken(tokens, XercesXPath::EXPRTOKEN_PERIOD);
                starIsMultiplyOperator = true;
                currentOffset++;
            } else if (XMLChar1_0::isWhitespace(ch)) {
                do {
                    if (++currentOffset == endOffset)
                        break;

                    ch = data[currentOffset];
                } while (XMLChar1_0::isWhitespace(ch));

                if (currentOffset == endOffset || ch == chPipe || ch == chForwardSlash) {
				    addToken(tokens, XercesXPath::EXPRTOKEN_PERIOD);
                    starIsMultiplyOperator = true;
                    break;
                }
            } else {
                XMLCh str[2]= {ch, 0 };
                ThrowXMLwithMemMgr1(XPathException, XMLExcepts::XPath_InvalidChar, str, tokens->getMemoryManager());
            }

            break;
        case CHARTYPE_ATSIGN:           // '@'
            addToken(tokens, XercesXPath::EXPRTOKEN_ATSIGN);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_COMMA:            // ','
            addToken(tokens, XercesXPath::EXPRTOKEN_COMMA);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_COLON:            // '::'
            if (++currentOffset == endOffset) {
                return false; // REVISIT
            }
            ch = data[currentOffset];

            if (ch != chColon) {
                return false; // REVISIT
            }
            addToken(tokens, XercesXPath::EXPRTOKEN_DOUBLE_COLON);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_SLASH:            // '/' and '//'
            if (++currentOffset == endOffset) {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_SLASH);
                starIsMultiplyOperator = false;
                break;
            }

            ch = data[currentOffset];

            if (ch == chForwardSlash) { // '//'
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_DOUBLE_SLASH);
                starIsMultiplyOperator = false;
                ++currentOffset;
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_SLASH);
                starIsMultiplyOperator = false;
            }
            break;
        case CHARTYPE_UNION:            // '|'
            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_UNION);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_PLUS:             // '+'
            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_PLUS);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_MINUS:            // '-'
            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_MINUS);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_EQUAL:            // '='
            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_EQUAL);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_EXCLAMATION:      // '!='
            if (++currentOffset == endOffset) {
                return false; // REVISIT
            }

            ch = data[currentOffset];

            if (ch != chEqual) {
                return false; // REVISIT
            }

            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_NOT_EQUAL);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_LESS: // '<' and '<='
            if (++currentOffset == endOffset) {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_LESS);
                starIsMultiplyOperator = false;
                break;
            }

            ch = data[currentOffset];

            if (ch == chEqual) { // '<='
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_LESS_EQUAL);
                starIsMultiplyOperator = false;
                ++currentOffset;
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_LESS);
                starIsMultiplyOperator = false;
            }
            break;
        case CHARTYPE_GREATER: // '>' and '>='
            if (++currentOffset == endOffset) {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_GREATER);
                starIsMultiplyOperator = false;
                break;
            }

            ch = data[currentOffset];

            if (ch == chEqual) { // '>='
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_GREATER_EQUAL);
                starIsMultiplyOperator = false;
                ++currentOffset;
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_GREATER);
                starIsMultiplyOperator = false;
            }
            break;
        //
        // [29] Literal ::= '"' [^"]* '"' | "'" [^']* "'"
        //
        case CHARTYPE_QUOTE:            // '\"' or '\''
            {
                XMLCh qchar = ch;
                if (++currentOffset == endOffset) {
                    return false; // REVISIT
                }

                ch = data[currentOffset];

                XMLSize_t litOffset = currentOffset;
                while (ch != qchar) {
                    if (++currentOffset == endOffset) {
                        return false; // REVISIT
                    }

                    ch = data[currentOffset];
                }

                addToken(tokens, XercesXPath::EXPRTOKEN_LITERAL);
                starIsMultiplyOperator = true;

                dataBuffer.set(data + litOffset, currentOffset - litOffset);
                tokens->addElement(fStringPool->addOrFind(dataBuffer.getRawBuffer()));
                ++currentOffset;
                break;
            }
        //
        // [30] Number ::= Digits ('.' Digits?)? | '.' Digits
        // [31] Digits ::= [0-9]+
        //
        case CHARTYPE_DIGIT:
            addToken(tokens, XercesXPath::EXPRTOKEN_NUMBER);
            starIsMultiplyOperator = true;
            currentOffset = scanNumber(data, endOffset, currentOffset, tokens);
            break;
        //
        // [36] VariableReference ::= '$' QName
        //
        case CHARTYPE_DOLLAR:
            if (++currentOffset == endOffset) {
                return false; // REVISIT
            }
            nameOffset = currentOffset;
            currentOffset = scanNCName(data, endOffset, currentOffset);

            if (currentOffset == nameOffset) {
                return false; // REVISIT
            }

            if (currentOffset < endOffset) {
                ch = data[currentOffset];
            }
            else {
                ch = 0;
            }

            dataBuffer.set(data + nameOffset, currentOffset - nameOffset);
            nameHandle = fStringPool->addOrFind(dataBuffer.getRawBuffer());
            prefixHandle = -1;

            if (ch == chColon) {

                prefixHandle = nameHandle;
                if (++currentOffset == endOffset) {
                    return false; // REVISIT
                }
                nameOffset = currentOffset;
                currentOffset = scanNCName(data, endOffset, currentOffset);

                if (currentOffset == nameOffset) {
                    return false; // REVISIT
                }

                dataBuffer.set(data + nameOffset, currentOffset - nameOffset);
                nameHandle = fStringPool->addOrFind(dataBuffer.getRawBuffer());
            }
            addToken(tokens, XercesXPath::EXPRTOKEN_VARIABLE_REFERENCE);
            starIsMultiplyOperator = true;
            tokens->addElement(prefixHandle);
            tokens->addElement(nameHandle);
            break;
        //
        // [37] NameTest ::= '*' | NCName ':' '*' | QName
        // [34] MultiplyOperator ::= '*'
        //
        case CHARTYPE_STAR:             // '*'
            //
            // 3.7 Lexical Structure
            //
            //  If there is a preceding token and the preceding token is not one of @, ::, (, [, , or
            //  an Operator, then a * must be recognized as a MultiplyOperator.
            //
            // Otherwise, the token must not be recognized as a MultiplyOperator.
            //
            if (starIsMultiplyOperator) {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_MULT);
                starIsMultiplyOperator = false;
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_NAMETEST_ANY);
                starIsMultiplyOperator = true;
            }

            ++currentOffset;
            break;
        //
        // NCName, QName and non-terminals
        //
        case CHARTYPE_NONASCII: // possibly a valid non-ascii 'Letter' (BaseChar | Ideographic)
        case CHARTYPE_LETTER:
        case CHARTYPE_UNDERSCORE:
            {
            //
            // 3.7 Lexical Structure
            //
            //  If there is a preceding token and the preceding token is not one of @, ::, (, [, , or
            //  an Operator, then an NCName must be recognized as an OperatorName.
            //
            //  If the character following an NCName (possibly after intervening ExprWhitespace) is (,
            //  then the token must be recognized as a NodeType or a FunctionName.
            //
            //  If the two characters following an NCName (possibly after intervening ExprWhitespace)
            //  are ::, then the token must be recognized as an AxisName.
            //
            //  Otherwise, the token must not be recognized as an OperatorName, a NodeType, a
            //  FunctionName, or an AxisName.
            //
            // [33] OperatorName ::= 'and' | 'or' | 'mod' | 'div'
            // [38] NodeType ::= 'comment' | 'text' | 'processing-instruction' | 'node'
            // [35] FunctionName ::= QName - NodeType
            // [6] AxisName ::= (see above)
            //
            // [37] NameTest ::= '*' | NCName ':' '*' | QName
            // [5] NCName ::= (Letter | '_') (NCNameChar)*
            // [?] NCNameChar ::= Letter | Digit | '.' | '-' | '_'  (ascii subset of 'NCNameChar')
            // [?] QName ::= (NCName ':')? NCName
            // [?] Letter ::= [A-Za-z]                              (ascii subset of 'Letter')
            // [?] Digit ::= [0-9]                                  (ascii subset of 'Digit')
            //
            nameOffset = currentOffset;
            currentOffset = scanNCName(data, endOffset, currentOffset);
            if (currentOffset == nameOffset) {
                return false; // REVISIT
			}

            if (currentOffset < endOffset) {
                ch = data[currentOffset];
            }
            else {
                ch = 0;
            }

            dataBuffer.set(data + nameOffset, currentOffset - nameOffset);
            nameHandle = fStringPool->addOrFind(dataBuffer.getRawBuffer());

            bool isNameTestNCName = false;
            bool isAxisName = false;
            prefixHandle = -1;

            if (ch == chColon) {

                if (++currentOffset == endOffset) {
                    return false; // REVISIT
                }

                ch = data[currentOffset];

                if (ch == chAsterisk) {
                    if (++currentOffset < endOffset) {
                        ch = data[currentOffset];
                    }

                    isNameTestNCName = true;
                } else if (ch == chColon) {
                    if (++currentOffset < endOffset) {
                        ch = data[currentOffset];
                    }

                    isAxisName = true;
                } else {
                    prefixHandle = nameHandle;
                    nameOffset = currentOffset;
                    currentOffset = scanNCName(data, endOffset, currentOffset);
                    if (currentOffset == nameOffset) {
                        return false; // REVISIT
                    }
                    if (currentOffset < endOffset) {
                        ch = data[currentOffset];
                    }
                    else {
                        ch = 0;
                    }

                    dataBuffer.set(data + nameOffset, currentOffset - nameOffset);
                    nameHandle = fStringPool->addOrFind(dataBuffer.getRawBuffer());
                }
            }
            //
            // [39] ExprWhitespace ::= S
            //
            while (XMLChar1_0::isWhitespace(ch)) {
                if (++currentOffset == endOffset) {
                    break;
                }
                ch = data[currentOffset];
            }

            //
            //  If there is a preceding token and the preceding token is not one of @, ::, (, [, , or
            //  an Operator, then an NCName must be recognized as an OperatorName.
            //
            if (starIsMultiplyOperator) {
                if (nameHandle == fAndSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_AND);
                    starIsMultiplyOperator = false;
                } else if (nameHandle == fOrSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_OR);
                    starIsMultiplyOperator = false;
                } else if (nameHandle == fModSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_MOD);
                    starIsMultiplyOperator = false;
                } else if (nameHandle == fDivSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_DIV);
                    starIsMultiplyOperator = false;
                } else {
                    return false; // REVISIT
                }

                if (isNameTestNCName) {
                    return false; // REVISIT - NCName:* where an OperatorName is required
                } else if (isAxisName) {
                    return false; // REVISIT - AxisName:: where an OperatorName is required
                }
                break;
            }
            //
            //  If the character following an NCName (possibly after intervening ExprWhitespace) is (,
            //  then the token must be recognized as a NodeType or a FunctionName.
            //
            if (ch == chOpenParen && !isNameTestNCName && !isAxisName) {
                if (nameHandle == fCommentSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_NODETYPE_COMMENT);
                } else if (nameHandle == fTextSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_NODETYPE_TEXT);
                } else if (nameHandle == fPISymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_NODETYPE_PI);
                } else if (nameHandle == fNodeSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_NODETYPE_NODE);
                } else {
                    addToken(tokens, XercesXPath::EXPRTOKEN_FUNCTION_NAME);
                    tokens->addElement(prefixHandle);
                    tokens->addElement(nameHandle);
                }
                addToken(tokens, XercesXPath::EXPRTOKEN_OPEN_PAREN);
                starIsMultiplyOperator = false;
                ++currentOffset;
                break;
            }

            //
            //  If the two characters following an NCName (possibly after intervening ExprWhitespace)
            //  are ::, then the token must be recognized as an AxisName.
            //
            if (isAxisName ||
                (ch == chColon && currentOffset + 1 < endOffset &&
                 data[currentOffset + 1] == chColon)) {

                if (nameHandle == fAncestorSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_ANCESTOR);
                } else if (nameHandle == fAncestorOrSelfSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_ANCESTOR_OR_SELF);
                } else if (nameHandle == fAttributeSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_ATTRIBUTE);
                } else if (nameHandle == fChildSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_CHILD);
                } else if (nameHandle == fDescendantSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_DESCENDANT);
                } else if (nameHandle == fDescendantOrSelfSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_DESCENDANT_OR_SELF);
                } else if (nameHandle == fFollowingSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_FOLLOWING);
                } else if (nameHandle == fFollowingSiblingSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_FOLLOWING_SIBLING);
                } else if (nameHandle == fNamespaceSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_NAMESPACE);
                } else if (nameHandle == fParentSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_PARENT);
                } else if (nameHandle == fPrecedingSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_PRECEDING);
                } else if (nameHandle == fPrecedingSiblingSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_PRECEDING_SIBLING);
                } else if (nameHandle == fSelfSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_SELF);
                } else {
                    return false; // REVISIT
                }

                if (isNameTestNCName) {
                    return false; // REVISIT - "NCName:* ::" where "AxisName ::" is required
                }

                addToken(tokens, XercesXPath::EXPRTOKEN_DOUBLE_COLON);
                starIsMultiplyOperator = false;
                if (!isAxisName) {
                    currentOffset += 2;
                }
                break;
            }
            //
            //  Otherwise, the token must not be recognized as an OperatorName, a NodeType, a
            //  FunctionName, or an AxisName.
            //
            if (isNameTestNCName) {
                addToken(tokens, XercesXPath::EXPRTOKEN_NAMETEST_NAMESPACE);
                tokens->addElement(nameHandle);
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_NAMETEST_QNAME);
                tokens->addElement(prefixHandle);
                tokens->addElement(nameHandle);
            }

            starIsMultiplyOperator = true;
            break;
            }
        default:
            {
            XMLCh str[2]= {ch, 0 };
            ThrowXMLwithMemMgr1(XPathException, XMLExcepts::XPath_InvalidChar, str, tokens->getMemoryManager());
            break;
            }
        }
    }

    return true;
}